

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O0

ON_String ON_SdkVersionNumberToString(uint sdk_version_number,uint sdk_service_release_number)

{
  uint in_EDX;
  undefined4 in_register_0000003c;
  ON_String *this;
  bool local_64;
  ON_String local_50;
  ON_String local_48;
  ON_String local_40;
  ON_String local_38 [3];
  undefined1 local_1b;
  byte local_1a;
  byte local_19;
  uint local_18;
  bool bValidServiceReleaseNumber;
  uint uStack_14;
  bool bValidVersionNumber;
  uint sdk_service_release_number_local;
  uint sdk_version_number_local;
  ON_String *str_version;
  
  this = (ON_String *)CONCAT44(in_register_0000003c,sdk_version_number);
  local_18 = in_EDX;
  uStack_14 = sdk_service_release_number;
  _sdk_service_release_number_local = this;
  local_19 = ON_VersionNumberIsValid(sdk_service_release_number);
  local_1a = ON_VersionNumberIsValid(local_18);
  local_1b = 0;
  ON_VersionNumberToString(sdk_version_number,SUB41(uStack_14,0),true);
  ON_String::operator+=(this,".");
  ON_VersionNumberToString((uint)local_38,SUB41(local_18,0),true);
  ON_String::operator+=(this,local_38);
  ON_String::~ON_String(local_38);
  if (((local_19 & 1) != 0) || ((local_1a & 1) != 0)) {
    ON_String::operator+=(this," (");
    local_64 = SUB41(uStack_14,0);
    if (((local_19 & 1) == (local_1a & 1)) && (uStack_14 != local_18)) {
      ON_VersionNumberToString((uint)&local_48,local_64,false);
      ON_String::operator+=(this,&local_48);
      ON_String::~ON_String(&local_48);
      ON_String::operator+=(this,", ");
      ON_VersionNumberToString((uint)&local_50,(bool)(undefined1)local_18,false);
      ON_String::operator+=(this,&local_50);
      ON_String::~ON_String(&local_50);
    }
    else {
      if ((local_19 & 1) == 0) {
        local_64 = SUB41(local_18,0);
      }
      ON_VersionNumberToString((uint)&local_40,local_64,false);
      ON_String::operator+=(this,&local_40);
      ON_String::~ON_String(&local_40);
    }
    ON_String::operator+=(this,")");
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_SdkVersionNumberToString(
  unsigned int sdk_version_number,
  unsigned int sdk_service_release_number
)
{
  const bool bValidVersionNumber = ON_VersionNumberIsValid(sdk_version_number);
  const bool bValidServiceReleaseNumber = ON_VersionNumberIsValid(sdk_service_release_number);
  ON_String str_version = ON_VersionNumberToString(sdk_version_number, true, false);
  str_version += ".";
  str_version += ON_VersionNumberToString(sdk_service_release_number, true, false);
  if (bValidVersionNumber || bValidServiceReleaseNumber)
  {
    str_version += " (";
    if (bValidVersionNumber != bValidServiceReleaseNumber || sdk_version_number == sdk_service_release_number )
    {
      str_version += ON_VersionNumberToString(bValidVersionNumber ? sdk_version_number : sdk_service_release_number, false, true);
    }
    else
    {
      str_version += ON_VersionNumberToString(sdk_version_number, false, true);
      str_version += ", ";
      str_version += ON_VersionNumberToString(sdk_service_release_number, false, true);
    }
    str_version += ")";
  }
  return str_version;
}